

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLiberty.c
# Opt level: O2

float Scl_LibertyReadPinCap(Scl_Tree_t *p,Scl_Item_t *pPin,char *pName)

{
  int iVar1;
  Scl_Item_t *pSVar2;
  char *__nptr;
  int *piVar3;
  double dVar4;
  
  piVar3 = &pPin->Child;
  while( true ) {
    pSVar2 = Scl_LibertyItem(p,*piVar3);
    if (pSVar2 == (Scl_Item_t *)0x0) {
      return 0.0;
    }
    iVar1 = Scl_LibertyCompare(p,pSVar2->Key,pName);
    if (iVar1 == 0) break;
    piVar3 = &pSVar2->Next;
  }
  __nptr = Scl_LibertyReadString(p,pSVar2->Head);
  dVar4 = atof(__nptr);
  return (float)dVar4;
}

Assistant:

float Scl_LibertyReadPinCap( Scl_Tree_t * p, Scl_Item_t * pPin, char * pName )
{
    Scl_Item_t * pItem;
    Scl_ItemForEachChildName( p, pPin, pItem, pName )
        return atof(Scl_LibertyReadString(p, pItem->Head));
    return 0;
}